

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.hpp
# Opt level: O2

bool __thiscall helics::NamedPoint::operator==(NamedPoint *this,NamedPoint *np)

{
  double dVar1;
  double dVar2;
  size_t __n;
  __type_conflict _Var3;
  int iVar4;
  
  dVar1 = this->value;
  dVar2 = np->value;
  if (NAN(dVar2) && NAN(dVar1)) {
    __n = (this->name)._M_string_length;
    if (__n == (np->name)._M_string_length) {
      iVar4 = CLI::std::char_traits<char>::compare
                        ((this->name)._M_dataplus._M_p,(np->name)._M_dataplus._M_p,__n);
      return iVar4 == 0;
    }
    return false;
  }
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    _Var3 = std::operator==(&this->name,&np->name);
    return _Var3;
  }
  return false;
}

Assistant:

bool operator==(const NamedPoint& np) const
    {
        return ((std::isnan(value)) && (std::isnan(np.value))) ?
            (name == np.name) :
            ((value == np.value) && (name == np.name));
    }